

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

void __thiscall
cmDocumentation::SetSection
          (cmDocumentation *this,char *name,
          vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *docs)

{
  cmDocumentationSection *this_00;
  allocator local_61;
  string local_60;
  string local_40;
  
  this_00 = (cmDocumentationSection *)operator_new(0x38);
  std::__cxx11::string::string((string *)&local_60,name,&local_61);
  cmsys::SystemTools::UpperCase(&local_40,&local_60);
  cmDocumentationSection::cmDocumentationSection(this_00,name,local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  cmDocumentationSection::Append(this_00,docs);
  SetSection(this,name,this_00);
  return;
}

Assistant:

void cmDocumentation::SetSection(const char *name,
                                 std::vector<cmDocumentationEntry> &docs)
{
  cmDocumentationSection *sec =
    new cmDocumentationSection(name,
                               cmSystemTools::UpperCase(name).c_str());
  sec->Append(docs);
  this->SetSection(name,sec);
}